

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompressor.cpp
# Opt level: O0

int __thiscall
Imf_3_4::Compressor::uncompress(Compressor *this,char *inPtr,int inSize,int minY,char **outPtr)

{
  uint64_t uVar1;
  Box<Imath_3_2::Vec2<int>_> *in_RSI;
  Box<Imath_3_2::Vec2<int>_> *in_RDI;
  Box2i range;
  int in_stack_0000005c;
  char *in_stack_00000060;
  Compressor *in_stack_00000068;
  Box<Imath_3_2::Vec2<int>_> *in_stack_ffffffffffffffb0;
  
  Header::dataWindow((Header *)0x18e89d);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box(in_stack_ffffffffffffffb0,in_RDI);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box(in_RSI,in_RDI);
  uVar1 = runDecodeStep(in_stack_00000068,in_stack_00000060,in_stack_0000005c,(Box2i *)this,
                        (char **)inPtr);
  return (int)uVar1;
}

Assistant:

int
Compressor::uncompress (
    const char* inPtr, int inSize, int minY, const char*& outPtr)
{
    IMATH_NAMESPACE::Box2i range = _header.dataWindow ();

    range.min.y = minY;
    range.max.y = minY + _numScanLines - 1;

    return static_cast<int> (
        runDecodeStep (inPtr, inSize, range, outPtr));
}